

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O0

void __thiscall QWidgetPrivate::setTextureChildSeen(QWidgetPrivate *this)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  QWidget *pQVar2;
  QWidgetPrivate *in_RDI;
  QWidget *parent;
  QWidget *q;
  
  this_00 = (QWidgetPrivate *)q_func(in_RDI);
  if ((*(uint *)&in_RDI->field_0x250 >> 0x19 & 1) == 0) {
    *(uint *)&in_RDI->field_0x250 = *(uint *)&in_RDI->field_0x250 & 0xfdffffff | 0x2000000;
    bVar1 = QWidget::isWindow((QWidget *)in_RDI);
    if ((!bVar1) && (pQVar2 = QWidget::parentWidget((QWidget *)0x34b7e1), pQVar2 != (QWidget *)0x0))
    {
      get((QWidget *)0x34b7f8);
      setTextureChildSeen(this_00);
    }
  }
  return;
}

Assistant:

void setTextureChildSeen()
    {
        Q_Q(QWidget);
        if (textureChildSeen)
            return;
        textureChildSeen = 1;

        if (!q->isWindow()) {
            QWidget *parent = q->parentWidget();
            if (parent)
                get(parent)->setTextureChildSeen();
        }
    }